

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_nop64_zero_Test::TestBody(CpuTest_nop64_zero_Test *this)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  MockSpec<unsigned_char_(unsigned_short)> *this_00;
  TypedExpectation<unsigned_char_(unsigned_short)> *this_01;
  char *message;
  AssertHelper local_a8;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  Action<unsigned_char_(unsigned_short)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<unsigned_short> local_48;
  MockSpec<unsigned_char_(unsigned_short)> local_30;
  CpuTest_nop64_zero_Test *local_10;
  CpuTest_nop64_zero_Test *this_local;
  
  local_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,'d');
  uVar1 = (this->super_CpuTest).expected.pc;
  if (SCARRY4((uint)uVar1,1)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  (this->super_CpuTest).expected.pc = uVar1 + 1;
  uVar1 = (this->super_CpuTest).registers.pc;
  if (!SCARRY4((uint)uVar1,1)) {
    testing::Matcher<unsigned_short>::Matcher(&local_48,uVar1 + 1);
    n_e_s::core::test::MockMmu::gmock_read_byte
              (&local_30,&(this->super_CpuTest).mmu.super_MockMmu,&local_48);
    testing::internal::GetWithoutMatchers();
    this_00 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                        (&local_30,local_55,(void *)0x0);
    this_01 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                        (this_00,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                         ,0x256,"mmu","read_byte(registers.pc + 1)");
    testing::Return<int>((testing *)&gtest_ar.message_,0xcd);
    testing::internal::ReturnAction::operator_cast_to_Action
              (&local_78,(ReturnAction *)&gtest_ar.message_);
    testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(this_01,&local_78)
    ;
    testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_78);
    testing::internal::ReturnAction<int>::~ReturnAction((ReturnAction<int> *)&gtest_ar.message_);
    testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_30);
    testing::Matcher<unsigned_short>::~Matcher(&local_48);
    n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x03');
    testing::internal::EqHelper::
    Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
              ((EqHelper *)local_98,"expected","registers",&(this->super_CpuTest).expected,
               &(this->super_CpuTest).registers);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar3) {
      testing::Message::Message(&local_a0);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_98);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                 ,0x259,message);
      testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      testing::Message::~Message(&local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    return;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

TEST_F(CpuTest, nop64_zero) {
    stage_instruction(NOP_ZERO64);
    expected.pc += 1;
    EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(0xCD));

    step_execution(3);
    EXPECT_EQ(expected, registers);
}